

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_attached_shaders(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLsizei local_20;
  GLuint local_1c;
  GLsizei count [1];
  GLuint program;
  GLuint shaderObject;
  GLuint shaders [1];
  NegativeTestContext *ctx_local;
  
  program = 0;
  _shaderObject = ctx;
  count[0] = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_1c = glu::CallLogWrapper::glCreateProgram(&_shaderObject->super_CallLogWrapper);
  pNVar1 = _shaderObject;
  local_20 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_41);
  NegativeTestContext::beginSection(pNVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glGetAttachedShaders
            (&_shaderObject->super_CallLogWrapper,0xffffffff,1,&local_20,&program);
  NegativeTestContext::expectError(_shaderObject,0x501);
  NegativeTestContext::endSection(_shaderObject);
  pNVar1 = _shaderObject;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetAttachedShaders
            (&_shaderObject->super_CallLogWrapper,count[0],1,&local_20,&program);
  NegativeTestContext::expectError(_shaderObject,0x502);
  NegativeTestContext::endSection(_shaderObject);
  pNVar1 = _shaderObject;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"GL_INVALID_VALUE is generated if maxCount is less than 0.",
             &local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glGetAttachedShaders
            (&_shaderObject->super_CallLogWrapper,local_1c,-1,&local_20,&program);
  NegativeTestContext::expectError(_shaderObject,0x501);
  NegativeTestContext::endSection(_shaderObject);
  glu::CallLogWrapper::glDeleteShader(&_shaderObject->super_CallLogWrapper,count[0]);
  glu::CallLogWrapper::glDeleteProgram(&_shaderObject->super_CallLogWrapper,local_1c);
  return;
}

Assistant:

void get_attached_shaders (NegativeTestContext& ctx)
{
	GLuint	shaders[1]		= { 0 };
	GLuint	shaderObject	= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint	program			= ctx.glCreateProgram();
	GLsizei	count[1]		= { 0 };

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetAttachedShaders(-1, 1, &count[0], &shaders[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetAttachedShaders(shaderObject, 1, &count[0], &shaders[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if maxCount is less than 0.");
	ctx.glGetAttachedShaders(program, -1, &count[0], &shaders[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteShader(shaderObject);
	ctx.glDeleteProgram(program);
}